

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68k-dis.c
# Opt level: O1

void floatformat_to_double(floatformat *fmt,void *from,double *to)

{
  undefined1 uVar1;
  uint uVar2;
  long lVar3;
  size_t __n;
  float *pfVar4;
  double dVar5;
  ulong in_XMM1_Qb;
  anon_union_16_4_e75842b7 u;
  undefined8 uStack_40;
  float local_38;
  uint uStack_34;
  ushort local_2e;
  double local_28;
  ulong uStack_20;
  
  pfVar4 = &local_38;
  uVar2 = fmt->len;
  __n = (size_t)(int)uVar2;
  uStack_40 = 0x12c694;
  memcpy(&local_38,from,__n);
  if (1 < (long)__n) {
    lVar3 = 0;
    do {
      uVar1 = *(undefined1 *)pfVar4;
      *(undefined1 *)pfVar4 = *(undefined1 *)((long)&uStack_40 + lVar3 + (__n - 0x39) + 0x40);
      *(undefined1 *)((long)&uStack_40 + lVar3 + (__n - 0x39) + 0x40) = uVar1;
      pfVar4 = (float *)((long)pfVar4 + 1);
      lVar3 = lVar3 + -1;
    } while (-lVar3 != (ulong)(uVar2 >> 1));
  }
  if (uVar2 == 4) {
    dVar5 = (double)local_38;
  }
  else if (uVar2 == 8) {
    dVar5 = (double)CONCAT44(uStack_34,local_38);
  }
  else {
    local_28 = (double)(CONCAT44(uStack_34,local_38) & 0x7fffffffffffffff) * 1.0842021724855044e-19
               + (double)(uStack_34 >> 0x1f);
    if ((short)local_2e < 0) {
      local_28 = -local_28;
      in_XMM1_Qb = in_XMM1_Qb ^ 0x8000000000000000;
    }
    uStack_40 = 0x12c73d;
    uStack_20 = in_XMM1_Qb;
    dVar5 = ldexp(1.0,(local_2e & 0x7fff) - 0x3fff);
    dVar5 = dVar5 * local_28;
  }
  *to = dVar5;
  return;
}

Assistant:

void floatformat_to_double(const struct floatformat* fmt, const void* from, double* to)
{
    // TODO: The code assumes a little endian machine

    union {
        bfd_byte buf[12];
        float f;
        double d;
        struct {
            uint32_t mantissa_low;
            uint32_t mantissa_high; // avoid padding
            uint16_t pad;
            uint16_t exp;
        } ext;
    } u;
    memcpy(u.buf, from, fmt->len);
    for (int i = 0; i < fmt->len / 2; ++i) {
        bfd_byte tmp = u.buf[i];
        u.buf[i] = u.buf[fmt->len - 1 - i];
        u.buf[fmt->len - 1 - i] = tmp;

    }
    if (fmt->len == 4) {
        *to = u.f;
        return;
    } else if (fmt->len == 8) {
        *to = u.d;
        return;
    }
    // Extended precision
    const uint64_t norm_mask = 0x8000000000000000;

    uint64_t mantissa = (uint64_t)u.ext.mantissa_high << 32 | u.ext.mantissa_low;

    const int sign = u.ext.exp & 0x8000 ? -1 : 1;
    const int norm = mantissa & norm_mask ? 1 : 0;
    mantissa &= norm_mask - 1;

    *to = sign * (norm + (double)mantissa  / (double)norm_mask) * pow(2, (u.ext.exp & 0x7fff) - 16383);
}